

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::GenerateClearBit_abi_cxx11_
          (string *__return_storage_ptr__,java *this,int bitIndex)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  uint uVar5;
  uint uVar6;
  undefined1 *local_f0;
  string mask;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 local_90 [8];
  string varName;
  long local_60;
  long lStack_58;
  size_type *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  uVar5 = (uint)this;
  uVar6 = uVar5 + 0x1f;
  if (-1 < (int)uVar5) {
    uVar6 = uVar5;
  }
  GetBitFieldName_abi_cxx11_((string *)local_90,(java *)(ulong)(uint)((int)uVar6 >> 5),bitIndex);
  std::__cxx11::string::string
            ((string *)&local_f0,
             *(char **)(bit_masks + (long)(int)(uVar5 - (uVar6 & 0xffffffe0)) * 8),
             (allocator *)(varName.field_2._M_local_buf + 8));
  local_50 = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_90,varName._M_dataplus._M_p + (long)local_90);
  std::__cxx11::string::append((char *)&local_50);
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_a0 = *plVar3;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar3;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_c0 = *plVar3;
    lStack_b8 = plVar2[3];
    mask.field_2._8_8_ = &local_c0;
  }
  else {
    local_c0 = *plVar3;
    mask.field_2._8_8_ = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append(mask.field_2._M_local_buf + 8,(ulong)local_f0);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar2[3];
    varName.field_2._8_8_ = &local_60;
  }
  else {
    local_60 = *plVar3;
    varName.field_2._8_8_ = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append(varName.field_2._M_local_buf + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((long *)varName.field_2._8_8_ != &local_60) {
    operator_delete((void *)varName.field_2._8_8_);
  }
  if ((long *)mask.field_2._8_8_ != &local_c0) {
    operator_delete((void *)mask.field_2._8_8_);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_50 != &__str._M_string_length) {
    operator_delete(local_50);
  }
  if ((size_type *)local_f0 != &mask._M_string_length) {
    operator_delete(local_f0);
  }
  if (local_90 != (undefined1  [8])&varName._M_string_length) {
    operator_delete((void *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateClearBit(int bitIndex) {
  std::string varName = GetBitFieldNameForBit(bitIndex);
  int bitInVarIndex = bitIndex % 32;

  std::string mask = bit_masks[bitInVarIndex];
  std::string result = varName + " = (" + varName + " & ~" + mask + ")";
  return result;
}